

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O1

void capnp::_::anon_unknown_133::
     genericCheckTestMessageAllZero<capnproto_test::capnp::test::TestAllTypes::Builder>
               (Builder reader)

{
  byte bVar1;
  char cVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  ArrayPtr<const_unsigned_char> AVar40;
  undefined1 auVar41 [15];
  CapTableBuilder *pCVar42;
  undefined8 uVar43;
  float fVar44;
  double dVar45;
  DebugComparison<bool,_bool> _kjCondition;
  bool local_e0;
  Builder subReader;
  DebugExpression<bool> _kjCondition_9;
  undefined1 auStack_af [7];
  CapTableBuilder *pCStack_a8;
  bool local_98;
  undefined7 uStack_97;
  DebugExpression<bool> _kjCondition_22;
  undefined3 uStack_87;
  undefined1 auStack_84 [36];
  PointerBuilder local_60;
  char *local_48 [3];
  
  bVar1 = *reader._builder.data;
  _kjCondition._0_8_ = ((ulong)CONCAT61(_kjCondition._2_6_,bVar1) & 0xffffffffffff01) << 8;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition._24_8_ = CONCAT71(_kjCondition._25_7_,bVar1) & 0xffffffffffffff01 ^ 1;
  if (((bVar1 & 1) != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar3[0xf] = 0;
    auVar3._0_15_ = (undefined1  [15])subReader._builder._1_15_;
    subReader._builder._0_16_ = auVar3 << 8;
    _kjCondition_9.value = (bool)(*reader._builder.data & 1);
    kj::_::Debug::log<char_const(&)[52],kj::_::DebugComparison<bool,bool>&,bool,bool>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1c5,ERROR,
               "\"failed: expected \" \"(false) == (reader.getBoolField())\", _kjCondition, false, reader.getBoolField()"
               ,(char (*) [52])"failed: expected (false) == (reader.getBoolField())",&_kjCondition,
               (bool *)&subReader,&_kjCondition_9.value);
  }
  cVar2 = *(char *)((long)reader._builder.data + 1);
  _kjCondition._0_8_ = (ulong)CONCAT31(_kjCondition._5_3_,cVar2) << 0x20;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if ((cVar2 != '\0') && (kj::_::Debug::minSeverity < 3)) {
    auVar4._12_4_ = 0;
    auVar4._0_12_ = (undefined1  [12])subReader._builder._4_12_;
    subReader._builder._0_16_ = auVar4 << 0x20;
    _kjCondition_9.value = (bool)*(undefined1 *)((long)reader._builder.data + 1);
    _kjCondition.result = cVar2 == '\0';
    kj::_::Debug::log<char_const(&)[48],kj::_::DebugComparison<int,signed_char>&,int,signed_char>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1c6,ERROR,
               "\"failed: expected \" \"(0) == (reader.getInt8Field())\", _kjCondition, 0, reader.getInt8Field()"
               ,(char (*) [48])"failed: expected (0) == (reader.getInt8Field())",
               (DebugComparison<int,_signed_char> *)&_kjCondition,(int *)&subReader,
               &_kjCondition_9.value);
  }
  _kjCondition._0_8_ =
       (ulong)CONCAT22(_kjCondition._6_2_,*(short *)((long)reader._builder.data + 2)) << 0x20;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = *(short *)((long)reader._builder.data + 2) == 0;
  if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
    auVar5._12_4_ = 0;
    auVar5._0_12_ = (undefined1  [12])subReader._builder._4_12_;
    subReader._builder._0_16_ = auVar5 << 0x20;
    __kjCondition_9 = *(undefined2 *)((long)reader._builder.data + 2);
    kj::_::Debug::log<char_const(&)[49],kj::_::DebugComparison<int,short>&,int,short>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1c7,ERROR,
               "\"failed: expected \" \"(0) == (reader.getInt16Field())\", _kjCondition, 0, reader.getInt16Field()"
               ,(char (*) [49])"failed: expected (0) == (reader.getInt16Field())",
               (DebugComparison<int,_short> *)&_kjCondition,(int *)&subReader,
               (short *)&_kjCondition_9);
  }
  _kjCondition._4_4_ = *(int *)((long)reader._builder.data + 4);
  _kjCondition.left = false;
  _kjCondition.right = false;
  _kjCondition._2_2_ = 0;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition._4_4_ == 0;
  if ((_kjCondition._4_4_ != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar6._12_4_ = 0;
    auVar6._0_12_ = (undefined1  [12])subReader._builder._4_12_;
    subReader._builder._0_16_ = auVar6 << 0x20;
    __kjCondition_9 = *(undefined4 *)((long)reader._builder.data + 4);
    kj::_::Debug::log<char_const(&)[49],kj::_::DebugComparison<int,int>&,int,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1c8,ERROR,
               "\"failed: expected \" \"(0) == (reader.getInt32Field())\", _kjCondition, 0, reader.getInt32Field()"
               ,(char (*) [49])"failed: expected (0) == (reader.getInt32Field())",
               (DebugComparison<int,_int> *)&_kjCondition,(int *)&subReader,(int *)&_kjCondition_9);
  }
  _kjCondition.op.content.ptr = *(char **)((long)reader._builder.data + 8);
  _kjCondition.left = false;
  _kjCondition.right = false;
  _kjCondition._2_2_ = 0;
  _kjCondition.op.content.size_ = (size_t)anon_var_dwarf_3a16;
  _kjCondition.result = true;
  _kjCondition._25_7_ = 0;
  if ((_kjCondition.op.content.ptr != (char *)0x0) && (kj::_::Debug::minSeverity < 3)) {
    auVar7._12_4_ = 0;
    auVar7._0_12_ = stack0xffffffffffffff54;
    __kjCondition_9 = (ArrayPtr<unsigned_char>)(auVar7 << 0x20);
    subReader._builder.segment = *(SegmentBuilder **)((long)reader._builder.data + 8);
    kj::_::Debug::log<char_const(&)[49],kj::_::DebugComparison<int,long>&,int,long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1c9,ERROR,
               "\"failed: expected \" \"(0) == (reader.getInt64Field())\", _kjCondition, 0, reader.getInt64Field()"
               ,(char (*) [49])"failed: expected (0) == (reader.getInt64Field())",
               (DebugComparison<int,_long> *)&_kjCondition,(int *)&_kjCondition_9,(long *)&subReader
              );
  }
  cVar2 = *(char *)((long)reader._builder.data + 0x10);
  _kjCondition._0_8_ = (ulong)CONCAT31(_kjCondition._5_3_,cVar2) << 0x20;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if ((cVar2 != '\0') && (kj::_::Debug::minSeverity < 3)) {
    auVar8._12_4_ = 0;
    auVar8._0_12_ = (undefined1  [12])subReader._builder._4_12_;
    subReader._builder._0_16_ = auVar8 << 0x20;
    _kjCondition_9.value = (bool)*(undefined1 *)((long)reader._builder.data + 0x10);
    _kjCondition.result = cVar2 == '\0';
    kj::_::Debug::
    log<char_const(&)[50],kj::_::DebugComparison<unsigned_int,unsigned_char>&,unsigned_int,unsigned_char>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1ca,ERROR,
               "\"failed: expected \" \"(0u) == (reader.getUInt8Field())\", _kjCondition, 0u, reader.getUInt8Field()"
               ,(char (*) [50])"failed: expected (0u) == (reader.getUInt8Field())",
               (DebugComparison<unsigned_int,_unsigned_char> *)&_kjCondition,(uint *)&subReader,
               &_kjCondition_9.value);
  }
  _kjCondition._0_8_ =
       (ulong)CONCAT22(_kjCondition._6_2_,*(short *)((long)reader._builder.data + 0x12)) << 0x20;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = *(short *)((long)reader._builder.data + 0x12) == 0;
  if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
    auVar9._12_4_ = 0;
    auVar9._0_12_ = (undefined1  [12])subReader._builder._4_12_;
    subReader._builder._0_16_ = auVar9 << 0x20;
    __kjCondition_9 = *(undefined2 *)((long)reader._builder.data + 0x12);
    kj::_::Debug::
    log<char_const(&)[51],kj::_::DebugComparison<unsigned_int,unsigned_short>&,unsigned_int,unsigned_short>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1cb,ERROR,
               "\"failed: expected \" \"(0u) == (reader.getUInt16Field())\", _kjCondition, 0u, reader.getUInt16Field()"
               ,(char (*) [51])"failed: expected (0u) == (reader.getUInt16Field())",
               (DebugComparison<unsigned_int,_unsigned_short> *)&_kjCondition,(uint *)&subReader,
               (unsigned_short *)&_kjCondition_9);
  }
  _kjCondition._4_4_ = *(int *)((long)reader._builder.data + 0x14);
  _kjCondition.left = false;
  _kjCondition.right = false;
  _kjCondition._2_2_ = 0;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition._4_4_ == 0;
  if ((_kjCondition._4_4_ != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar10._12_4_ = 0;
    auVar10._0_12_ = (undefined1  [12])subReader._builder._4_12_;
    subReader._builder._0_16_ = auVar10 << 0x20;
    __kjCondition_9 = *(undefined4 *)((long)reader._builder.data + 0x14);
    kj::_::Debug::
    log<char_const(&)[51],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1cc,ERROR,
               "\"failed: expected \" \"(0u) == (reader.getUInt32Field())\", _kjCondition, 0u, reader.getUInt32Field()"
               ,(char (*) [51])"failed: expected (0u) == (reader.getUInt32Field())",
               (DebugComparison<unsigned_int,_unsigned_int> *)&_kjCondition,(uint *)&subReader,
               (uint *)&_kjCondition_9);
  }
  _kjCondition.op.content.ptr = *(char **)((long)reader._builder.data + 0x18);
  _kjCondition.left = false;
  _kjCondition.right = false;
  _kjCondition._2_2_ = 0;
  _kjCondition.op.content.size_ = (size_t)anon_var_dwarf_3a16;
  _kjCondition.result = true;
  _kjCondition._25_7_ = 0;
  if ((_kjCondition.op.content.ptr != (char *)0x0) && (kj::_::Debug::minSeverity < 3)) {
    auVar11._12_4_ = 0;
    auVar11._0_12_ = stack0xffffffffffffff54;
    __kjCondition_9 = (ArrayPtr<unsigned_char>)(auVar11 << 0x20);
    subReader._builder.segment = *(SegmentBuilder **)((long)reader._builder.data + 0x18);
    kj::_::Debug::
    log<char_const(&)[51],kj::_::DebugComparison<unsigned_int,unsigned_long>&,unsigned_int,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1cd,ERROR,
               "\"failed: expected \" \"(0u) == (reader.getUInt64Field())\", _kjCondition, 0u, reader.getUInt64Field()"
               ,(char (*) [51])"failed: expected (0u) == (reader.getUInt64Field())",
               (DebugComparison<unsigned_int,_unsigned_long> *)&_kjCondition,(uint *)&_kjCondition_9
               ,(unsigned_long *)&subReader);
  }
  AVar40 = (ArrayPtr<const_unsigned_char>)__kjCondition_9;
  _kjCondition._0_4_ = *(float *)((long)reader._builder.data + 0x20);
  auVar41 = _auStack_af;
  if (((float)_kjCondition._0_4_ != 0.0) || (NAN((float)_kjCondition._0_4_))) {
    fVar44 = -(float)_kjCondition._0_4_;
    if (-(float)_kjCondition._0_4_ <= (float)_kjCondition._0_4_) {
      fVar44 = (float)_kjCondition._0_4_;
    }
    _kjCondition_9.value = fVar44 < fVar44 * 1e-05;
    if ((fVar44 * 1e-05 <= fVar44) && (kj::_::Debug::minSeverity < 3)) {
      auVar12._12_4_ = 0;
      auVar12._0_12_ = (undefined1  [12])subReader._builder._4_12_;
      subReader._builder._0_16_ = auVar12 << 0x20;
      kj::_::Debug::log<char_const(&)[72],kj::_::DebugExpression<bool>&,float,int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1ce,ERROR,
                 "\"failed: expected \" \"::kj::_::floatAlmostEqual(reader.getFloat32Field(), 0)\", _kjCondition, reader.getFloat32Field(), 0"
                 ,(char (*) [72])
                  "failed: expected ::kj::_::floatAlmostEqual(reader.getFloat32Field(), 0)",
                 &_kjCondition_9,(float *)&_kjCondition,(int *)&subReader);
    }
  }
  _kjCondition._0_8_ = *(double *)((long)reader._builder.data + 0x28);
  pCStack_a8 = (CapTableBuilder *)AVar40.size_;
  pCVar42 = pCStack_a8;
  if (((double)_kjCondition._0_8_ != 0.0) || (NAN((double)_kjCondition._0_8_))) {
    dVar45 = -(double)_kjCondition._0_8_;
    if (-(double)_kjCondition._0_8_ <= (double)_kjCondition._0_8_) {
      dVar45 = (double)_kjCondition._0_8_;
    }
    _kjCondition_9.value = dVar45 < dVar45 * 1e-12;
    __kjCondition_9 = (ArrayPtr<unsigned_char>)CONCAT151(auVar41,_kjCondition_9.value);
    if ((dVar45 * 1e-12 <= dVar45) && (kj::_::Debug::minSeverity < 3)) {
      auVar13._12_4_ = 0;
      auVar13._0_12_ = (undefined1  [12])subReader._builder._4_12_;
      subReader._builder._0_16_ = auVar13 << 0x20;
      kj::_::Debug::log<char_const(&)[73],kj::_::DebugExpression<bool>&,double,int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1cf,ERROR,
                 "\"failed: expected \" \"::kj::_::doubleAlmostEqual(reader.getFloat64Field(), 0)\", _kjCondition, reader.getFloat64Field(), 0"
                 ,(char (*) [73])
                  "failed: expected ::kj::_::doubleAlmostEqual(reader.getFloat64Field(), 0)",
                 &_kjCondition_9,(double *)&_kjCondition,(int *)&subReader);
      pCVar42 = pCStack_a8;
    }
  }
  pCStack_a8 = pCVar42;
  __kjCondition_9 = (SegmentBuilder *)"";
  _kjCondition._0_8_ = reader._builder.segment;
  _kjCondition.op.content.ptr = (char *)reader._builder.capTable;
  _kjCondition.op.content.size_ = (size_t)reader._builder.pointers;
  PointerBuilder::getBlob<capnp::Text>
            ((Builder *)&subReader,(PointerBuilder *)&_kjCondition,(void *)0x0,0);
  kj::_::DebugExpression<char_const(&)[1]>::operator==
            ((DebugComparison<const_char_(&)[1],_capnp::Text::Builder> *)&_kjCondition,
             (DebugExpression<char_const(&)[1]> *)&_kjCondition_9,(Builder *)&subReader);
  subReader._builder._0_16_ = reader._builder._0_16_;
  auVar3 = (undefined1  [16])subReader._builder._0_16_;
  if ((local_e0 == false) && (kj::_::Debug::minSeverity < 3)) {
    subReader._builder.data = reader._builder.pointers;
    PointerBuilder::getBlob<capnp::Text>
              ((Builder *)&_kjCondition_9,(PointerBuilder *)&subReader,(void *)0x0,0);
    kj::_::Debug::
    log<char_const(&)[49],kj::_::DebugComparison<char_const(&)[1],capnp::Text::Builder>&,char_const(&)[1],capnp::Text::Builder>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1d0,ERROR,
               "\"failed: expected \" \"(\\\"\\\") == (reader.getTextField())\", _kjCondition, \"\", reader.getTextField()"
               ,(char (*) [49])"failed: expected (\"\") == (reader.getTextField())",
               (DebugComparison<const_char_(&)[1],_capnp::Text::Builder> *)&_kjCondition,
               (char (*) [1])0x54bab9,(Builder *)&_kjCondition_9);
  }
  subReader._builder._0_16_ = ZEXT816(0x54bab9);
  _kjCondition.op.content.size_ = (size_t)(reader._builder.pointers + 1);
  _kjCondition._0_8_ = reader._builder.segment;
  _kjCondition.op.content.ptr = (char *)reader._builder.capTable;
  __kjCondition_9 =
       (ArrayPtr<unsigned_char>)
       PointerBuilder::getBlob<capnp::Data>((PointerBuilder *)&_kjCondition,(void *)0x0,0);
  kj::_::DebugExpression<capnp::Data::Reader>::operator==
            ((DebugExpression<capnp::Data::Reader> *)&subReader,(Builder *)&_kjCondition_9);
  if ((local_e0 == false) && (kj::_::Debug::minSeverity < 3)) {
    __kjCondition_9 = (ArrayPtr<unsigned_char>)ZEXT816(0x54bab9);
    subReader._builder.data = reader._builder.pointers + 1;
    subReader._builder._0_16_ = auVar3;
    subReader._builder._0_16_ =
         PointerBuilder::getBlob<capnp::Data>((PointerBuilder *)&subReader,(void *)0x0,0);
    kj::_::Debug::
    log<char_const(&)[55],kj::_::DebugComparison<capnp::Data::Reader,capnp::Data::Builder>&,capnp::Data::Reader,capnp::Data::Builder>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1d1,ERROR,
               "\"failed: expected \" \"(data(\\\"\\\")) == (reader.getDataField())\", _kjCondition, data(\"\"), reader.getDataField()"
               ,(char (*) [55])"failed: expected (data(\"\")) == (reader.getDataField())",
               (DebugComparison<capnp::Data::Reader,_capnp::Data::Builder> *)&_kjCondition,
               (Reader *)&_kjCondition_9,(Builder *)&subReader);
  }
  _kjCondition.op.content.size_ = (size_t)(reader._builder.pointers + 2);
  _kjCondition._0_8_ = reader._builder.segment;
  _kjCondition.op.content.ptr = (char *)reader._builder.capTable;
  PointerBuilder::getStruct
            (&subReader._builder,(PointerBuilder *)&_kjCondition,(StructSize)0x140006,(word *)0x0);
  bVar1 = *subReader._builder.data;
  _kjCondition._0_8_ = ((ulong)CONCAT61(_kjCondition._2_6_,bVar1) & 0xffffffffffff01) << 8;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition._24_8_ = CONCAT71(_kjCondition._25_7_,bVar1) & 0xffffffffffffff01 ^ 1;
  if (((bVar1 & 1) != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar14[0xf] = 0;
    auVar14._0_15_ = _auStack_af;
    __kjCondition_9 = (ArrayPtr<unsigned_char>)(auVar14 << 8);
    _kjCondition_22.value = (bool)(*subReader._builder.data & 1);
    kj::_::Debug::log<char_const(&)[55],kj::_::DebugComparison<bool,bool>&,bool,bool>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1d5,ERROR,
               "\"failed: expected \" \"(false) == (subReader.getBoolField())\", _kjCondition, false, subReader.getBoolField()"
               ,(char (*) [55])"failed: expected (false) == (subReader.getBoolField())",
               &_kjCondition,(bool *)&_kjCondition_9,&_kjCondition_22.value);
  }
  cVar2 = *(char *)((long)subReader._builder.data + 1);
  _kjCondition._0_8_ = (ulong)CONCAT31(_kjCondition._5_3_,cVar2) << 0x20;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if ((cVar2 != '\0') && (kj::_::Debug::minSeverity < 3)) {
    auVar15._12_4_ = 0;
    auVar15._0_12_ = stack0xffffffffffffff54;
    __kjCondition_9 = (ArrayPtr<unsigned_char>)(auVar15 << 0x20);
    _kjCondition_22.value = (bool)*(undefined1 *)((long)subReader._builder.data + 1);
    _kjCondition.result = cVar2 == '\0';
    kj::_::Debug::log<char_const(&)[51],kj::_::DebugComparison<int,signed_char>&,int,signed_char>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1d6,ERROR,
               "\"failed: expected \" \"(0) == (subReader.getInt8Field())\", _kjCondition, 0, subReader.getInt8Field()"
               ,(char (*) [51])"failed: expected (0) == (subReader.getInt8Field())",
               (DebugComparison<int,_signed_char> *)&_kjCondition,(int *)&_kjCondition_9,
               &_kjCondition_22.value);
  }
  _kjCondition._0_8_ =
       (ulong)CONCAT22(_kjCondition._6_2_,*(short *)((long)subReader._builder.data + 2)) << 0x20;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = *(short *)((long)subReader._builder.data + 2) == 0;
  if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
    auVar16._12_4_ = 0;
    auVar16._0_12_ = stack0xffffffffffffff54;
    __kjCondition_9 = (ArrayPtr<unsigned_char>)(auVar16 << 0x20);
    __kjCondition_22 = *(undefined2 *)((long)subReader._builder.data + 2);
    kj::_::Debug::log<char_const(&)[52],kj::_::DebugComparison<int,short>&,int,short>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1d7,ERROR,
               "\"failed: expected \" \"(0) == (subReader.getInt16Field())\", _kjCondition, 0, subReader.getInt16Field()"
               ,(char (*) [52])"failed: expected (0) == (subReader.getInt16Field())",
               (DebugComparison<int,_short> *)&_kjCondition,(int *)&_kjCondition_9,
               (short *)&_kjCondition_22);
  }
  _kjCondition._4_4_ = *(int *)((long)subReader._builder.data + 4);
  _kjCondition.left = false;
  _kjCondition.right = false;
  _kjCondition._2_2_ = 0;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition._4_4_ == 0;
  if ((_kjCondition._4_4_ != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar17._12_4_ = 0;
    auVar17._0_12_ = stack0xffffffffffffff54;
    __kjCondition_9 = (ArrayPtr<unsigned_char>)(auVar17 << 0x20);
    __kjCondition_22 = *(undefined4 *)((long)subReader._builder.data + 4);
    kj::_::Debug::log<char_const(&)[52],kj::_::DebugComparison<int,int>&,int,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1d8,ERROR,
               "\"failed: expected \" \"(0) == (subReader.getInt32Field())\", _kjCondition, 0, subReader.getInt32Field()"
               ,(char (*) [52])"failed: expected (0) == (subReader.getInt32Field())",
               (DebugComparison<int,_int> *)&_kjCondition,(int *)&_kjCondition_9,
               (int *)&_kjCondition_22);
  }
  _kjCondition.op.content.ptr = *(char **)((long)subReader._builder.data + 8);
  _kjCondition.left = false;
  _kjCondition.right = false;
  _kjCondition._2_2_ = 0;
  _kjCondition.op.content.size_ = (size_t)anon_var_dwarf_3a16;
  _kjCondition.result = true;
  _kjCondition._25_7_ = 0;
  if ((_kjCondition.op.content.ptr != (char *)0x0) && (kj::_::Debug::minSeverity < 3)) {
    auVar18._12_4_ = 0;
    auVar18._0_12_ = auStack_84._0_12_;
    __kjCondition_22 = (ArrayPtr<unsigned_char>)(auVar18 << 0x20);
    __kjCondition_9 = (SegmentBuilder *)*(uchar **)((long)subReader._builder.data + 8);
    kj::_::Debug::log<char_const(&)[52],kj::_::DebugComparison<int,long>&,int,long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1d9,ERROR,
               "\"failed: expected \" \"(0) == (subReader.getInt64Field())\", _kjCondition, 0, subReader.getInt64Field()"
               ,(char (*) [52])"failed: expected (0) == (subReader.getInt64Field())",
               (DebugComparison<int,_long> *)&_kjCondition,(int *)&_kjCondition_22,
               (long *)&_kjCondition_9);
  }
  cVar2 = *(char *)((long)subReader._builder.data + 0x10);
  _kjCondition._0_8_ = (ulong)CONCAT31(_kjCondition._5_3_,cVar2) << 0x20;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  if ((cVar2 != '\0') && (kj::_::Debug::minSeverity < 3)) {
    auVar19._12_4_ = 0;
    auVar19._0_12_ = stack0xffffffffffffff54;
    __kjCondition_9 = (ArrayPtr<unsigned_char>)(auVar19 << 0x20);
    _kjCondition_22.value = (bool)*(undefined1 *)((long)subReader._builder.data + 0x10);
    _kjCondition.result = cVar2 == '\0';
    kj::_::Debug::
    log<char_const(&)[53],kj::_::DebugComparison<unsigned_int,unsigned_char>&,unsigned_int,unsigned_char>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1da,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.getUInt8Field())\", _kjCondition, 0u, subReader.getUInt8Field()"
               ,(char (*) [53])"failed: expected (0u) == (subReader.getUInt8Field())",
               (DebugComparison<unsigned_int,_unsigned_char> *)&_kjCondition,(uint *)&_kjCondition_9
               ,&_kjCondition_22.value);
  }
  _kjCondition._0_8_ =
       (ulong)CONCAT22(_kjCondition._6_2_,*(short *)((long)subReader._builder.data + 0x12)) << 0x20;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = *(short *)((long)subReader._builder.data + 0x12) == 0;
  if ((!_kjCondition.result) && (kj::_::Debug::minSeverity < 3)) {
    auVar20._12_4_ = 0;
    auVar20._0_12_ = stack0xffffffffffffff54;
    __kjCondition_9 = (ArrayPtr<unsigned_char>)(auVar20 << 0x20);
    __kjCondition_22 = *(undefined2 *)((long)subReader._builder.data + 0x12);
    kj::_::Debug::
    log<char_const(&)[54],kj::_::DebugComparison<unsigned_int,unsigned_short>&,unsigned_int,unsigned_short>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1db,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.getUInt16Field())\", _kjCondition, 0u, subReader.getUInt16Field()"
               ,(char (*) [54])"failed: expected (0u) == (subReader.getUInt16Field())",
               (DebugComparison<unsigned_int,_unsigned_short> *)&_kjCondition,
               (uint *)&_kjCondition_9,(unsigned_short *)&_kjCondition_22);
  }
  _kjCondition._4_4_ = *(int *)((long)subReader._builder.data + 0x14);
  _kjCondition.left = false;
  _kjCondition.right = false;
  _kjCondition._2_2_ = 0;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition._4_4_ == 0;
  if ((_kjCondition._4_4_ != 0) && (kj::_::Debug::minSeverity < 3)) {
    auVar21._12_4_ = 0;
    auVar21._0_12_ = stack0xffffffffffffff54;
    __kjCondition_9 = (ArrayPtr<unsigned_char>)(auVar21 << 0x20);
    __kjCondition_22 = *(undefined4 *)((long)subReader._builder.data + 0x14);
    kj::_::Debug::
    log<char_const(&)[54],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1dc,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.getUInt32Field())\", _kjCondition, 0u, subReader.getUInt32Field()"
               ,(char (*) [54])"failed: expected (0u) == (subReader.getUInt32Field())",
               (DebugComparison<unsigned_int,_unsigned_int> *)&_kjCondition,(uint *)&_kjCondition_9,
               (uint *)&_kjCondition_22);
  }
  _kjCondition.op.content.ptr = *(char **)((long)subReader._builder.data + 0x18);
  _kjCondition.left = false;
  _kjCondition.right = false;
  _kjCondition._2_2_ = 0;
  _kjCondition.op.content.size_ = (size_t)anon_var_dwarf_3a16;
  _kjCondition.result = true;
  _kjCondition._25_7_ = 0;
  if ((_kjCondition.op.content.ptr != (char *)0x0) && (kj::_::Debug::minSeverity < 3)) {
    auVar22._12_4_ = 0;
    auVar22._0_12_ = auStack_84._0_12_;
    __kjCondition_22 = (ArrayPtr<unsigned_char>)(auVar22 << 0x20);
    __kjCondition_9 = (SegmentBuilder *)*(uchar **)((long)subReader._builder.data + 0x18);
    kj::_::Debug::
    log<char_const(&)[54],kj::_::DebugComparison<unsigned_int,unsigned_long>&,unsigned_int,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1dd,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.getUInt64Field())\", _kjCondition, 0u, subReader.getUInt64Field()"
               ,(char (*) [54])"failed: expected (0u) == (subReader.getUInt64Field())",
               (DebugComparison<unsigned_int,_unsigned_long> *)&_kjCondition,
               (uint *)&_kjCondition_22,(unsigned_long *)&_kjCondition_9);
  }
  AVar40 = (ArrayPtr<const_unsigned_char>)__kjCondition_22;
  _kjCondition._0_4_ = *(float *)((long)subReader._builder.data + 0x20);
  auVar41 = _uStack_87;
  if (((float)_kjCondition._0_4_ != 0.0) || (NAN((float)_kjCondition._0_4_))) {
    fVar44 = -(float)_kjCondition._0_4_;
    if (-(float)_kjCondition._0_4_ <= (float)_kjCondition._0_4_) {
      fVar44 = (float)_kjCondition._0_4_;
    }
    _kjCondition_22.value = fVar44 < fVar44 * 1e-05;
    if ((fVar44 * 1e-05 <= fVar44) && (kj::_::Debug::minSeverity < 3)) {
      auVar23._12_4_ = 0;
      auVar23._0_12_ = stack0xffffffffffffff54;
      __kjCondition_9 = (ArrayPtr<unsigned_char>)(auVar23 << 0x20);
      kj::_::Debug::log<char_const(&)[75],kj::_::DebugExpression<bool>&,float,int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1de,ERROR,
                 "\"failed: expected \" \"::kj::_::floatAlmostEqual(subReader.getFloat32Field(), 0)\", _kjCondition, subReader.getFloat32Field(), 0"
                 ,(char (*) [75])
                  "failed: expected ::kj::_::floatAlmostEqual(subReader.getFloat32Field(), 0)",
                 &_kjCondition_22,(float *)&_kjCondition,(int *)&_kjCondition_9);
    }
  }
  _kjCondition._0_8_ = *(double *)((long)subReader._builder.data + 0x28);
  auStack_84._4_8_ = AVar40.size_;
  uVar43 = auStack_84._4_8_;
  if (((double)_kjCondition._0_8_ != 0.0) || (NAN((double)_kjCondition._0_8_))) {
    dVar45 = -(double)_kjCondition._0_8_;
    if (-(double)_kjCondition._0_8_ <= (double)_kjCondition._0_8_) {
      dVar45 = (double)_kjCondition._0_8_;
    }
    _kjCondition_22.value = dVar45 < dVar45 * 1e-12;
    __kjCondition_22 = (ArrayPtr<unsigned_char>)CONCAT151(auVar41,_kjCondition_22.value);
    if ((dVar45 * 1e-12 <= dVar45) && (kj::_::Debug::minSeverity < 3)) {
      auVar24._12_4_ = 0;
      auVar24._0_12_ = stack0xffffffffffffff54;
      __kjCondition_9 = (ArrayPtr<unsigned_char>)(auVar24 << 0x20);
      kj::_::Debug::log<char_const(&)[76],kj::_::DebugExpression<bool>&,double,int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x1df,ERROR,
                 "\"failed: expected \" \"::kj::_::doubleAlmostEqual(subReader.getFloat64Field(), 0)\", _kjCondition, subReader.getFloat64Field(), 0"
                 ,(char (*) [76])
                  "failed: expected ::kj::_::doubleAlmostEqual(subReader.getFloat64Field(), 0)",
                 &_kjCondition_22,(double *)&_kjCondition,(int *)&_kjCondition_9);
      uVar43 = auStack_84._4_8_;
    }
  }
  auStack_84._4_8_ = uVar43;
  __kjCondition_22 = (SegmentBuilder *)"";
  _kjCondition._0_8_ = subReader._builder.segment;
  _kjCondition.op.content.ptr = (char *)subReader._builder.capTable;
  PointerBuilder::getBlob<capnp::Text>
            ((Builder *)&_kjCondition_9,(PointerBuilder *)&_kjCondition,(void *)0x0,0);
  kj::_::DebugExpression<char_const(&)[1]>::operator==
            ((DebugComparison<const_char_(&)[1],_capnp::Text::Builder> *)&_kjCondition,
             (DebugExpression<char_const(&)[1]> *)&_kjCondition_22,(Builder *)&_kjCondition_9);
  if ((local_e0 == false) && (kj::_::Debug::minSeverity < 3)) {
    __kjCondition_9 = subReader._builder.segment;
    pCStack_a8 = subReader._builder.capTable;
    PointerBuilder::getBlob<capnp::Text>
              ((Builder *)&_kjCondition_22,(PointerBuilder *)&_kjCondition_9,(void *)0x0,0);
    kj::_::Debug::
    log<char_const(&)[52],kj::_::DebugComparison<char_const(&)[1],capnp::Text::Builder>&,char_const(&)[1],capnp::Text::Builder>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1e0,ERROR,
               "\"failed: expected \" \"(\\\"\\\") == (subReader.getTextField())\", _kjCondition, \"\", subReader.getTextField()"
               ,(char (*) [52])"failed: expected (\"\") == (subReader.getTextField())",
               (DebugComparison<const_char_(&)[1],_capnp::Text::Builder> *)&_kjCondition,
               (char (*) [1])0x54bab9,(Builder *)&_kjCondition_22);
  }
  __kjCondition_9 = (ArrayPtr<unsigned_char>)ZEXT816(0x54bab9);
  _kjCondition.op.content.size_ =
       CONCAT71(subReader._builder.pointers._1_7_,subReader._builder.pointers._0_1_) + 8;
  _kjCondition._0_8_ = subReader._builder.segment;
  _kjCondition.op.content.ptr = (char *)subReader._builder.capTable;
  __kjCondition_22 =
       (ArrayPtr<unsigned_char>)
       PointerBuilder::getBlob<capnp::Data>((PointerBuilder *)&_kjCondition,(void *)0x0,0);
  kj::_::DebugExpression<capnp::Data::Reader>::operator==
            ((DebugExpression<capnp::Data::Reader> *)&_kjCondition_9,(Builder *)&_kjCondition_22);
  if ((local_e0 == false) && (kj::_::Debug::minSeverity < 3)) {
    __kjCondition_22 = (ArrayPtr<unsigned_char>)ZEXT816(0x54bab9);
    __kjCondition_9 = subReader._builder.segment;
    pCStack_a8 = subReader._builder.capTable;
    __kjCondition_9 =
         (ArrayPtr<unsigned_char>)
         PointerBuilder::getBlob<capnp::Data>((PointerBuilder *)&_kjCondition_9,(void *)0x0,0);
    kj::_::Debug::
    log<char_const(&)[58],kj::_::DebugComparison<capnp::Data::Reader,capnp::Data::Builder>&,capnp::Data::Reader,capnp::Data::Builder>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1e1,ERROR,
               "\"failed: expected \" \"(data(\\\"\\\")) == (subReader.getDataField())\", _kjCondition, data(\"\"), subReader.getDataField()"
               ,(char (*) [58])"failed: expected (data(\"\")) == (subReader.getDataField())",
               (DebugComparison<capnp::Data::Reader,_capnp::Data::Builder> *)&_kjCondition,
               (Reader *)&_kjCondition_22,(Builder *)&_kjCondition_9);
  }
  _kjCondition.op.content.size_ =
       CONCAT71(subReader._builder.pointers._1_7_,subReader._builder.pointers._0_1_) + 0x10;
  _kjCondition._0_8_ = subReader._builder.segment;
  _kjCondition.op.content.ptr = (char *)subReader._builder.capTable;
  PointerBuilder::getStruct
            ((StructBuilder *)&_kjCondition_9,(PointerBuilder *)&_kjCondition,(StructSize)0x140006,
             (word *)0x0);
  local_60.segment = (SegmentBuilder *)0x54bab9;
  _kjCondition._0_8_ = __kjCondition_9;
  _kjCondition.op.content.ptr = (char *)pCStack_a8;
  PointerBuilder::getBlob<capnp::Text>
            ((Builder *)&_kjCondition_22,(PointerBuilder *)&_kjCondition,(void *)0x0,0);
  kj::_::DebugExpression<char_const(&)[1]>::operator==
            ((DebugComparison<const_char_(&)[1],_capnp::Text::Builder> *)&_kjCondition,
             (DebugExpression<char_const(&)[1]> *)&local_60,(Builder *)&_kjCondition_22);
  if ((local_e0 == false) && (kj::_::Debug::minSeverity < 3)) {
    __kjCondition_22 = __kjCondition_9;
    PointerBuilder::getBlob<capnp::Text>
              ((Builder *)&local_60,(PointerBuilder *)&_kjCondition_22,(void *)0x0,0);
    kj::_::Debug::
    log<char_const(&)[55],kj::_::DebugComparison<char_const(&)[1],capnp::Text::Builder>&,char_const(&)[1],capnp::Text::Builder>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1e4,ERROR,
               "\"failed: expected \" \"(\\\"\\\") == (subSubReader.getTextField())\", _kjCondition, \"\", subSubReader.getTextField()"
               ,(char (*) [55])"failed: expected (\"\") == (subSubReader.getTextField())",
               (DebugComparison<const_char_(&)[1],_capnp::Text::Builder> *)&_kjCondition,
               (char (*) [1])0x54bab9,(Builder *)&local_60);
  }
  local_48[0] = "";
  _kjCondition.op.content.size_ = CONCAT71(uStack_97,local_98) + 0x10;
  _kjCondition._0_8_ = __kjCondition_9;
  _kjCondition.op.content.ptr = (char *)pCStack_a8;
  PointerBuilder::getStruct
            ((StructBuilder *)&_kjCondition_22,(PointerBuilder *)&_kjCondition,(StructSize)0x140006,
             (word *)0x0);
  _kjCondition._0_8_ = __kjCondition_22;
  _kjCondition.op.content.ptr = (char *)auStack_84._4_8_;
  PointerBuilder::getBlob<capnp::Text>
            ((Builder *)&local_60,(PointerBuilder *)&_kjCondition,(void *)0x0,0);
  kj::_::DebugExpression<char_const(&)[1]>::operator==
            ((DebugComparison<const_char_(&)[1],_capnp::Text::Builder> *)&_kjCondition,
             (DebugExpression<char_const(&)[1]> *)local_48,(Builder *)&local_60);
  if ((local_e0 == false) && (kj::_::Debug::minSeverity < 3)) {
    local_60.pointer = (WirePointer *)(CONCAT71(uStack_97,local_98) + 0x10);
    local_60.segment = __kjCondition_9;
    local_60.capTable = pCStack_a8;
    PointerBuilder::getStruct
              ((StructBuilder *)&_kjCondition_22,&local_60,(StructSize)0x140006,(word *)0x0);
    local_60.segment = __kjCondition_22;
    local_60.capTable = (CapTableBuilder *)auStack_84._4_8_;
    PointerBuilder::getBlob<capnp::Text>((Builder *)local_48,&local_60,(void *)0x0,0);
    kj::_::Debug::
    log<char_const(&)[72],kj::_::DebugComparison<char_const(&)[1],capnp::Text::Builder>&,char_const(&)[1],capnp::Text::Builder>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1e5,ERROR,
               "\"failed: expected \" \"(\\\"\\\") == (subSubReader.getStructField().getTextField())\", _kjCondition, \"\", subSubReader.getStructField().getTextField()"
               ,(char (*) [72])
                "failed: expected (\"\") == (subSubReader.getStructField().getTextField())",
               (DebugComparison<const_char_(&)[1],_capnp::Text::Builder> *)&_kjCondition,
               (char (*) [1])0x54bab9,(Builder *)local_48);
  }
  __kjCondition_9 = subReader._builder.segment;
  pCStack_a8 = subReader._builder.capTable;
  PointerBuilder::getList
            ((ListBuilder *)&_kjCondition,(PointerBuilder *)&_kjCondition_9,VOID,(word *)0x0);
  __kjCondition_9 = (SegmentBuilder *)(_kjCondition._24_8_ << 0x20);
  if ((_kjCondition._24_4_ != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_60.segment = (SegmentBuilder *)((ulong)local_60.segment & 0xffffffff00000000);
    __kjCondition_22 = subReader._builder.segment;
    auStack_84._4_8_ = subReader._builder.capTable;
    PointerBuilder::getList
              ((ListBuilder *)&_kjCondition,(PointerBuilder *)&_kjCondition_22,VOID,(word *)0x0);
    uVar43 = _kjCondition._24_8_;
    _kjCondition_22.value = _kjCondition.result;
    uStack_87 = _kjCondition._25_3_;
    _kjCondition._24_8_ = uVar43;
    kj::_::Debug::
    log<char_const(&)[58],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1e8,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.getVoidList().size())\", _kjCondition, 0u, subReader.getVoidList().size()"
               ,(char (*) [58])"failed: expected (0u) == (subReader.getVoidList().size())",
               (DebugComparison<unsigned_int,_unsigned_int> *)&_kjCondition_9,(uint *)&local_60,
               (uint *)&_kjCondition_22);
  }
  __kjCondition_9 = subReader._builder.segment;
  pCStack_a8 = subReader._builder.capTable;
  PointerBuilder::getList
            ((ListBuilder *)&_kjCondition,(PointerBuilder *)&_kjCondition_9,BIT,(word *)0x0);
  __kjCondition_9 = (SegmentBuilder *)(_kjCondition._24_8_ << 0x20);
  if ((_kjCondition._24_4_ != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_60.segment = (SegmentBuilder *)((ulong)local_60.segment & 0xffffffff00000000);
    __kjCondition_22 = subReader._builder.segment;
    auStack_84._4_8_ = subReader._builder.capTable;
    PointerBuilder::getList
              ((ListBuilder *)&_kjCondition,(PointerBuilder *)&_kjCondition_22,BIT,(word *)0x0);
    uVar43 = _kjCondition._24_8_;
    _kjCondition_22.value = _kjCondition.result;
    uStack_87 = _kjCondition._25_3_;
    _kjCondition._24_8_ = uVar43;
    kj::_::Debug::
    log<char_const(&)[58],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1e9,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.getBoolList().size())\", _kjCondition, 0u, subReader.getBoolList().size()"
               ,(char (*) [58])"failed: expected (0u) == (subReader.getBoolList().size())",
               (DebugComparison<unsigned_int,_unsigned_int> *)&_kjCondition_9,(uint *)&local_60,
               (uint *)&_kjCondition_22);
  }
  __kjCondition_9 = subReader._builder.segment;
  pCStack_a8 = subReader._builder.capTable;
  PointerBuilder::getList
            ((ListBuilder *)&_kjCondition,(PointerBuilder *)&_kjCondition_9,BYTE,(word *)0x0);
  __kjCondition_9 = (SegmentBuilder *)(_kjCondition._24_8_ << 0x20);
  if ((_kjCondition._24_4_ != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_60.segment = (SegmentBuilder *)((ulong)local_60.segment & 0xffffffff00000000);
    __kjCondition_22 = subReader._builder.segment;
    auStack_84._4_8_ = subReader._builder.capTable;
    PointerBuilder::getList
              ((ListBuilder *)&_kjCondition,(PointerBuilder *)&_kjCondition_22,BYTE,(word *)0x0);
    uVar43 = _kjCondition._24_8_;
    _kjCondition_22.value = _kjCondition.result;
    uStack_87 = _kjCondition._25_3_;
    _kjCondition._24_8_ = uVar43;
    kj::_::Debug::
    log<char_const(&)[58],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1ea,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.getInt8List().size())\", _kjCondition, 0u, subReader.getInt8List().size()"
               ,(char (*) [58])"failed: expected (0u) == (subReader.getInt8List().size())",
               (DebugComparison<unsigned_int,_unsigned_int> *)&_kjCondition_9,(uint *)&local_60,
               (uint *)&_kjCondition_22);
  }
  __kjCondition_9 = subReader._builder.segment;
  pCStack_a8 = subReader._builder.capTable;
  PointerBuilder::getList
            ((ListBuilder *)&_kjCondition,(PointerBuilder *)&_kjCondition_9,TWO_BYTES,(word *)0x0);
  __kjCondition_9 = (SegmentBuilder *)(_kjCondition._24_8_ << 0x20);
  if ((_kjCondition._24_4_ != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_60.segment = (SegmentBuilder *)((ulong)local_60.segment & 0xffffffff00000000);
    __kjCondition_22 = subReader._builder.segment;
    auStack_84._4_8_ = subReader._builder.capTable;
    PointerBuilder::getList
              ((ListBuilder *)&_kjCondition,(PointerBuilder *)&_kjCondition_22,TWO_BYTES,(word *)0x0
              );
    uVar43 = _kjCondition._24_8_;
    _kjCondition_22.value = _kjCondition.result;
    uStack_87 = _kjCondition._25_3_;
    _kjCondition._24_8_ = uVar43;
    kj::_::Debug::
    log<char_const(&)[59],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1eb,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.getInt16List().size())\", _kjCondition, 0u, subReader.getInt16List().size()"
               ,(char (*) [59])"failed: expected (0u) == (subReader.getInt16List().size())",
               (DebugComparison<unsigned_int,_unsigned_int> *)&_kjCondition_9,(uint *)&local_60,
               (uint *)&_kjCondition_22);
  }
  __kjCondition_9 = subReader._builder.segment;
  pCStack_a8 = subReader._builder.capTable;
  PointerBuilder::getList
            ((ListBuilder *)&_kjCondition,(PointerBuilder *)&_kjCondition_9,FOUR_BYTES,(word *)0x0);
  __kjCondition_9 = (SegmentBuilder *)(_kjCondition._24_8_ << 0x20);
  if ((_kjCondition._24_4_ != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_60.segment = (SegmentBuilder *)((ulong)local_60.segment & 0xffffffff00000000);
    __kjCondition_22 = subReader._builder.segment;
    auStack_84._4_8_ = subReader._builder.capTable;
    PointerBuilder::getList
              ((ListBuilder *)&_kjCondition,(PointerBuilder *)&_kjCondition_22,FOUR_BYTES,
               (word *)0x0);
    uVar43 = _kjCondition._24_8_;
    _kjCondition_22.value = _kjCondition.result;
    uStack_87 = _kjCondition._25_3_;
    _kjCondition._24_8_ = uVar43;
    kj::_::Debug::
    log<char_const(&)[59],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1ec,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.getInt32List().size())\", _kjCondition, 0u, subReader.getInt32List().size()"
               ,(char (*) [59])"failed: expected (0u) == (subReader.getInt32List().size())",
               (DebugComparison<unsigned_int,_unsigned_int> *)&_kjCondition_9,(uint *)&local_60,
               (uint *)&_kjCondition_22);
  }
  __kjCondition_9 = subReader._builder.segment;
  pCStack_a8 = subReader._builder.capTable;
  PointerBuilder::getList
            ((ListBuilder *)&_kjCondition,(PointerBuilder *)&_kjCondition_9,EIGHT_BYTES,(word *)0x0)
  ;
  __kjCondition_9 = (SegmentBuilder *)(_kjCondition._24_8_ << 0x20);
  if ((_kjCondition._24_4_ != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_60.segment = (SegmentBuilder *)((ulong)local_60.segment & 0xffffffff00000000);
    __kjCondition_22 = subReader._builder.segment;
    auStack_84._4_8_ = subReader._builder.capTable;
    PointerBuilder::getList
              ((ListBuilder *)&_kjCondition,(PointerBuilder *)&_kjCondition_22,EIGHT_BYTES,
               (word *)0x0);
    uVar43 = _kjCondition._24_8_;
    _kjCondition_22.value = _kjCondition.result;
    uStack_87 = _kjCondition._25_3_;
    _kjCondition._24_8_ = uVar43;
    kj::_::Debug::
    log<char_const(&)[59],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1ed,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.getInt64List().size())\", _kjCondition, 0u, subReader.getInt64List().size()"
               ,(char (*) [59])"failed: expected (0u) == (subReader.getInt64List().size())",
               (DebugComparison<unsigned_int,_unsigned_int> *)&_kjCondition_9,(uint *)&local_60,
               (uint *)&_kjCondition_22);
  }
  __kjCondition_9 = subReader._builder.segment;
  pCStack_a8 = subReader._builder.capTable;
  PointerBuilder::getList
            ((ListBuilder *)&_kjCondition,(PointerBuilder *)&_kjCondition_9,BYTE,(word *)0x0);
  __kjCondition_9 = (SegmentBuilder *)(_kjCondition._24_8_ << 0x20);
  if ((_kjCondition._24_4_ != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_60.segment = (SegmentBuilder *)((ulong)local_60.segment & 0xffffffff00000000);
    __kjCondition_22 = subReader._builder.segment;
    auStack_84._4_8_ = subReader._builder.capTable;
    PointerBuilder::getList
              ((ListBuilder *)&_kjCondition,(PointerBuilder *)&_kjCondition_22,BYTE,(word *)0x0);
    uVar43 = _kjCondition._24_8_;
    _kjCondition_22.value = _kjCondition.result;
    uStack_87 = _kjCondition._25_3_;
    _kjCondition._24_8_ = uVar43;
    kj::_::Debug::
    log<char_const(&)[59],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1ee,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.getUInt8List().size())\", _kjCondition, 0u, subReader.getUInt8List().size()"
               ,(char (*) [59])"failed: expected (0u) == (subReader.getUInt8List().size())",
               (DebugComparison<unsigned_int,_unsigned_int> *)&_kjCondition_9,(uint *)&local_60,
               (uint *)&_kjCondition_22);
  }
  __kjCondition_9 = subReader._builder.segment;
  pCStack_a8 = subReader._builder.capTable;
  PointerBuilder::getList
            ((ListBuilder *)&_kjCondition,(PointerBuilder *)&_kjCondition_9,TWO_BYTES,(word *)0x0);
  __kjCondition_9 = (SegmentBuilder *)(_kjCondition._24_8_ << 0x20);
  if ((_kjCondition._24_4_ != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_60.segment = (SegmentBuilder *)((ulong)local_60.segment & 0xffffffff00000000);
    __kjCondition_22 = subReader._builder.segment;
    auStack_84._4_8_ = subReader._builder.capTable;
    PointerBuilder::getList
              ((ListBuilder *)&_kjCondition,(PointerBuilder *)&_kjCondition_22,TWO_BYTES,(word *)0x0
              );
    uVar43 = _kjCondition._24_8_;
    _kjCondition_22.value = _kjCondition.result;
    uStack_87 = _kjCondition._25_3_;
    _kjCondition._24_8_ = uVar43;
    kj::_::Debug::
    log<char_const(&)[60],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1ef,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.getUInt16List().size())\", _kjCondition, 0u, subReader.getUInt16List().size()"
               ,(char (*) [60])"failed: expected (0u) == (subReader.getUInt16List().size())",
               (DebugComparison<unsigned_int,_unsigned_int> *)&_kjCondition_9,(uint *)&local_60,
               (uint *)&_kjCondition_22);
  }
  __kjCondition_9 = subReader._builder.segment;
  pCStack_a8 = subReader._builder.capTable;
  PointerBuilder::getList
            ((ListBuilder *)&_kjCondition,(PointerBuilder *)&_kjCondition_9,FOUR_BYTES,(word *)0x0);
  __kjCondition_9 = (SegmentBuilder *)(_kjCondition._24_8_ << 0x20);
  if ((_kjCondition._24_4_ != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_60.segment = (SegmentBuilder *)((ulong)local_60.segment & 0xffffffff00000000);
    __kjCondition_22 = subReader._builder.segment;
    auStack_84._4_8_ = subReader._builder.capTable;
    PointerBuilder::getList
              ((ListBuilder *)&_kjCondition,(PointerBuilder *)&_kjCondition_22,FOUR_BYTES,
               (word *)0x0);
    uVar43 = _kjCondition._24_8_;
    _kjCondition_22.value = _kjCondition.result;
    uStack_87 = _kjCondition._25_3_;
    _kjCondition._24_8_ = uVar43;
    kj::_::Debug::
    log<char_const(&)[60],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1f0,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.getUInt32List().size())\", _kjCondition, 0u, subReader.getUInt32List().size()"
               ,(char (*) [60])"failed: expected (0u) == (subReader.getUInt32List().size())",
               (DebugComparison<unsigned_int,_unsigned_int> *)&_kjCondition_9,(uint *)&local_60,
               (uint *)&_kjCondition_22);
  }
  __kjCondition_9 = subReader._builder.segment;
  pCStack_a8 = subReader._builder.capTable;
  PointerBuilder::getList
            ((ListBuilder *)&_kjCondition,(PointerBuilder *)&_kjCondition_9,EIGHT_BYTES,(word *)0x0)
  ;
  __kjCondition_9 = (SegmentBuilder *)(_kjCondition._24_8_ << 0x20);
  if ((_kjCondition._24_4_ != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_60.segment = (SegmentBuilder *)((ulong)local_60.segment & 0xffffffff00000000);
    __kjCondition_22 = subReader._builder.segment;
    auStack_84._4_8_ = subReader._builder.capTable;
    PointerBuilder::getList
              ((ListBuilder *)&_kjCondition,(PointerBuilder *)&_kjCondition_22,EIGHT_BYTES,
               (word *)0x0);
    uVar43 = _kjCondition._24_8_;
    _kjCondition_22.value = _kjCondition.result;
    uStack_87 = _kjCondition._25_3_;
    _kjCondition._24_8_ = uVar43;
    kj::_::Debug::
    log<char_const(&)[60],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1f1,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.getUInt64List().size())\", _kjCondition, 0u, subReader.getUInt64List().size()"
               ,(char (*) [60])"failed: expected (0u) == (subReader.getUInt64List().size())",
               (DebugComparison<unsigned_int,_unsigned_int> *)&_kjCondition_9,(uint *)&local_60,
               (uint *)&_kjCondition_22);
  }
  __kjCondition_9 = subReader._builder.segment;
  pCStack_a8 = subReader._builder.capTable;
  PointerBuilder::getList
            ((ListBuilder *)&_kjCondition,(PointerBuilder *)&_kjCondition_9,FOUR_BYTES,(word *)0x0);
  __kjCondition_9 = (SegmentBuilder *)(_kjCondition._24_8_ << 0x20);
  if ((_kjCondition._24_4_ != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_60.segment = (SegmentBuilder *)((ulong)local_60.segment & 0xffffffff00000000);
    __kjCondition_22 = subReader._builder.segment;
    auStack_84._4_8_ = subReader._builder.capTable;
    PointerBuilder::getList
              ((ListBuilder *)&_kjCondition,(PointerBuilder *)&_kjCondition_22,FOUR_BYTES,
               (word *)0x0);
    uVar43 = _kjCondition._24_8_;
    _kjCondition_22.value = _kjCondition.result;
    uStack_87 = _kjCondition._25_3_;
    _kjCondition._24_8_ = uVar43;
    kj::_::Debug::
    log<char_const(&)[61],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1f2,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.getFloat32List().size())\", _kjCondition, 0u, subReader.getFloat32List().size()"
               ,(char (*) [61])"failed: expected (0u) == (subReader.getFloat32List().size())",
               (DebugComparison<unsigned_int,_unsigned_int> *)&_kjCondition_9,(uint *)&local_60,
               (uint *)&_kjCondition_22);
  }
  __kjCondition_9 = subReader._builder.segment;
  pCStack_a8 = subReader._builder.capTable;
  PointerBuilder::getList
            ((ListBuilder *)&_kjCondition,(PointerBuilder *)&_kjCondition_9,EIGHT_BYTES,(word *)0x0)
  ;
  __kjCondition_9 = (SegmentBuilder *)(_kjCondition._24_8_ << 0x20);
  if ((_kjCondition._24_4_ != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_60.segment = (SegmentBuilder *)((ulong)local_60.segment & 0xffffffff00000000);
    __kjCondition_22 = subReader._builder.segment;
    auStack_84._4_8_ = subReader._builder.capTable;
    PointerBuilder::getList
              ((ListBuilder *)&_kjCondition,(PointerBuilder *)&_kjCondition_22,EIGHT_BYTES,
               (word *)0x0);
    uVar43 = _kjCondition._24_8_;
    _kjCondition_22.value = _kjCondition.result;
    uStack_87 = _kjCondition._25_3_;
    _kjCondition._24_8_ = uVar43;
    kj::_::Debug::
    log<char_const(&)[61],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,499,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.getFloat64List().size())\", _kjCondition, 0u, subReader.getFloat64List().size()"
               ,(char (*) [61])"failed: expected (0u) == (subReader.getFloat64List().size())",
               (DebugComparison<unsigned_int,_unsigned_int> *)&_kjCondition_9,(uint *)&local_60,
               (uint *)&_kjCondition_22);
  }
  __kjCondition_9 = subReader._builder.segment;
  pCStack_a8 = subReader._builder.capTable;
  PointerBuilder::getList
            ((ListBuilder *)&_kjCondition,(PointerBuilder *)&_kjCondition_9,POINTER,(word *)0x0);
  __kjCondition_9 = (SegmentBuilder *)(_kjCondition._24_8_ << 0x20);
  if ((_kjCondition._24_4_ != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_60.segment = (SegmentBuilder *)((ulong)local_60.segment & 0xffffffff00000000);
    __kjCondition_22 = subReader._builder.segment;
    auStack_84._4_8_ = subReader._builder.capTable;
    PointerBuilder::getList
              ((ListBuilder *)&_kjCondition,(PointerBuilder *)&_kjCondition_22,POINTER,(word *)0x0);
    uVar43 = _kjCondition._24_8_;
    _kjCondition_22.value = _kjCondition.result;
    uStack_87 = _kjCondition._25_3_;
    _kjCondition._24_8_ = uVar43;
    kj::_::Debug::
    log<char_const(&)[58],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,500,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.getTextList().size())\", _kjCondition, 0u, subReader.getTextList().size()"
               ,(char (*) [58])"failed: expected (0u) == (subReader.getTextList().size())",
               (DebugComparison<unsigned_int,_unsigned_int> *)&_kjCondition_9,(uint *)&local_60,
               (uint *)&_kjCondition_22);
  }
  __kjCondition_9 = subReader._builder.segment;
  pCStack_a8 = subReader._builder.capTable;
  PointerBuilder::getList
            ((ListBuilder *)&_kjCondition,(PointerBuilder *)&_kjCondition_9,POINTER,(word *)0x0);
  __kjCondition_9 = (SegmentBuilder *)(_kjCondition._24_8_ << 0x20);
  if ((_kjCondition._24_4_ != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_60.segment = (SegmentBuilder *)((ulong)local_60.segment & 0xffffffff00000000);
    __kjCondition_22 = subReader._builder.segment;
    auStack_84._4_8_ = subReader._builder.capTable;
    PointerBuilder::getList
              ((ListBuilder *)&_kjCondition,(PointerBuilder *)&_kjCondition_22,POINTER,(word *)0x0);
    uVar43 = _kjCondition._24_8_;
    _kjCondition_22.value = _kjCondition.result;
    uStack_87 = _kjCondition._25_3_;
    _kjCondition._24_8_ = uVar43;
    kj::_::Debug::
    log<char_const(&)[58],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1f5,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.getDataList().size())\", _kjCondition, 0u, subReader.getDataList().size()"
               ,(char (*) [58])"failed: expected (0u) == (subReader.getDataList().size())",
               (DebugComparison<unsigned_int,_unsigned_int> *)&_kjCondition_9,(uint *)&local_60,
               (uint *)&_kjCondition_22);
  }
  __kjCondition_9 = subReader._builder.segment;
  pCStack_a8 = subReader._builder.capTable;
  PointerBuilder::getStructList
            ((ListBuilder *)&_kjCondition,(PointerBuilder *)&_kjCondition_9,(StructSize)0x140006,
             (word *)0x0);
  __kjCondition_9 = (SegmentBuilder *)(_kjCondition._24_8_ << 0x20);
  pCStack_a8 = (CapTableBuilder *)" == ";
  if ((_kjCondition._24_4_ != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_60.segment = (SegmentBuilder *)((ulong)local_60.segment & 0xffffffff00000000);
    __kjCondition_22 = subReader._builder.segment;
    auStack_84._4_8_ = subReader._builder.capTable;
    PointerBuilder::getStructList
              ((ListBuilder *)&_kjCondition,(PointerBuilder *)&_kjCondition_22,(StructSize)0x140006,
               (word *)0x0);
    uVar43 = _kjCondition._24_8_;
    _kjCondition_22.value = _kjCondition.result;
    uStack_87 = _kjCondition._25_3_;
    _kjCondition._24_8_ = uVar43;
    kj::_::Debug::
    log<char_const(&)[60],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1f6,ERROR,
               "\"failed: expected \" \"(0u) == (subReader.getStructList().size())\", _kjCondition, 0u, subReader.getStructList().size()"
               ,(char (*) [60])"failed: expected (0u) == (subReader.getStructList().size())",
               (DebugComparison<unsigned_int,_unsigned_int> *)&_kjCondition_9,(uint *)&local_60,
               (uint *)&_kjCondition_22);
  }
  subReader._builder.data = reader._builder.pointers + 3;
  subReader._builder._0_16_ = auVar3;
  PointerBuilder::getList
            ((ListBuilder *)&_kjCondition,(PointerBuilder *)&subReader,VOID,(word *)0x0);
  subReader._builder.segment = (SegmentBuilder *)(_kjCondition._24_8_ << 0x20);
  subReader._builder.capTable = (CapTableBuilder *)anon_var_dwarf_3a16;
  subReader._builder.data = &DAT_00000005;
  subReader._builder.pointers._0_1_ = _kjCondition._24_4_ == 0;
  if ((!(bool)subReader._builder.pointers._0_1_) && (kj::_::Debug::minSeverity < 3)) {
    auVar25._12_4_ = 0;
    auVar25._0_12_ = auStack_84._0_12_;
    __kjCondition_22 = (ArrayPtr<unsigned_char>)(auVar25 << 0x20);
    __kjCondition_9 = (ArrayPtr<unsigned_char>)auVar3;
    PointerBuilder::getList
              ((ListBuilder *)&_kjCondition,(PointerBuilder *)&_kjCondition_9,VOID,(word *)0x0);
    uVar43 = _kjCondition._24_8_;
    _kjCondition_9.value = _kjCondition.result;
    auStack_af._0_3_ = _kjCondition._25_3_;
    _kjCondition._24_8_ = uVar43;
    kj::_::Debug::
    log<char_const(&)[55],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1f9,ERROR,
               "\"failed: expected \" \"(0u) == (reader.getVoidList().size())\", _kjCondition, 0u, reader.getVoidList().size()"
               ,(char (*) [55])"failed: expected (0u) == (reader.getVoidList().size())",
               (DebugComparison<unsigned_int,_unsigned_int> *)&subReader,(uint *)&_kjCondition_22,
               (uint *)&_kjCondition_9);
  }
  subReader._builder.data = reader._builder.pointers + 4;
  subReader._builder._0_16_ = auVar3;
  PointerBuilder::getList((ListBuilder *)&_kjCondition,(PointerBuilder *)&subReader,BIT,(word *)0x0)
  ;
  subReader._builder.segment = (SegmentBuilder *)(_kjCondition._24_8_ << 0x20);
  subReader._builder.capTable = (CapTableBuilder *)anon_var_dwarf_3a16;
  subReader._builder.data = &DAT_00000005;
  subReader._builder.pointers._0_1_ = _kjCondition._24_4_ == 0;
  if ((!(bool)subReader._builder.pointers._0_1_) && (kj::_::Debug::minSeverity < 3)) {
    auVar26._12_4_ = 0;
    auVar26._0_12_ = auStack_84._0_12_;
    __kjCondition_22 = (ArrayPtr<unsigned_char>)(auVar26 << 0x20);
    __kjCondition_9 = (ArrayPtr<unsigned_char>)auVar3;
    PointerBuilder::getList
              ((ListBuilder *)&_kjCondition,(PointerBuilder *)&_kjCondition_9,BIT,(word *)0x0);
    uVar43 = _kjCondition._24_8_;
    _kjCondition_9.value = _kjCondition.result;
    auStack_af._0_3_ = _kjCondition._25_3_;
    _kjCondition._24_8_ = uVar43;
    kj::_::Debug::
    log<char_const(&)[55],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1fa,ERROR,
               "\"failed: expected \" \"(0u) == (reader.getBoolList().size())\", _kjCondition, 0u, reader.getBoolList().size()"
               ,(char (*) [55])"failed: expected (0u) == (reader.getBoolList().size())",
               (DebugComparison<unsigned_int,_unsigned_int> *)&subReader,(uint *)&_kjCondition_22,
               (uint *)&_kjCondition_9);
  }
  subReader._builder.data = reader._builder.pointers + 5;
  subReader._builder._0_16_ = auVar3;
  PointerBuilder::getList
            ((ListBuilder *)&_kjCondition,(PointerBuilder *)&subReader,BYTE,(word *)0x0);
  subReader._builder.segment = (SegmentBuilder *)(_kjCondition._24_8_ << 0x20);
  subReader._builder.capTable = (CapTableBuilder *)anon_var_dwarf_3a16;
  subReader._builder.data = &DAT_00000005;
  subReader._builder.pointers._0_1_ = _kjCondition._24_4_ == 0;
  if ((!(bool)subReader._builder.pointers._0_1_) && (kj::_::Debug::minSeverity < 3)) {
    auVar27._12_4_ = 0;
    auVar27._0_12_ = auStack_84._0_12_;
    __kjCondition_22 = (ArrayPtr<unsigned_char>)(auVar27 << 0x20);
    __kjCondition_9 = (ArrayPtr<unsigned_char>)auVar3;
    PointerBuilder::getList
              ((ListBuilder *)&_kjCondition,(PointerBuilder *)&_kjCondition_9,BYTE,(word *)0x0);
    uVar43 = _kjCondition._24_8_;
    _kjCondition_9.value = _kjCondition.result;
    auStack_af._0_3_ = _kjCondition._25_3_;
    _kjCondition._24_8_ = uVar43;
    kj::_::Debug::
    log<char_const(&)[55],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1fb,ERROR,
               "\"failed: expected \" \"(0u) == (reader.getInt8List().size())\", _kjCondition, 0u, reader.getInt8List().size()"
               ,(char (*) [55])"failed: expected (0u) == (reader.getInt8List().size())",
               (DebugComparison<unsigned_int,_unsigned_int> *)&subReader,(uint *)&_kjCondition_22,
               (uint *)&_kjCondition_9);
  }
  subReader._builder.data = reader._builder.pointers + 6;
  subReader._builder._0_16_ = auVar3;
  PointerBuilder::getList
            ((ListBuilder *)&_kjCondition,(PointerBuilder *)&subReader,TWO_BYTES,(word *)0x0);
  subReader._builder.segment = (SegmentBuilder *)(_kjCondition._24_8_ << 0x20);
  subReader._builder.capTable = (CapTableBuilder *)anon_var_dwarf_3a16;
  subReader._builder.data = &DAT_00000005;
  subReader._builder.pointers._0_1_ = _kjCondition._24_4_ == 0;
  if ((!(bool)subReader._builder.pointers._0_1_) && (kj::_::Debug::minSeverity < 3)) {
    auVar28._12_4_ = 0;
    auVar28._0_12_ = auStack_84._0_12_;
    __kjCondition_22 = (ArrayPtr<unsigned_char>)(auVar28 << 0x20);
    __kjCondition_9 = (ArrayPtr<unsigned_char>)auVar3;
    PointerBuilder::getList
              ((ListBuilder *)&_kjCondition,(PointerBuilder *)&_kjCondition_9,TWO_BYTES,(word *)0x0)
    ;
    uVar43 = _kjCondition._24_8_;
    _kjCondition_9.value = _kjCondition.result;
    auStack_af._0_3_ = _kjCondition._25_3_;
    _kjCondition._24_8_ = uVar43;
    kj::_::Debug::
    log<char_const(&)[56],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1fc,ERROR,
               "\"failed: expected \" \"(0u) == (reader.getInt16List().size())\", _kjCondition, 0u, reader.getInt16List().size()"
               ,(char (*) [56])"failed: expected (0u) == (reader.getInt16List().size())",
               (DebugComparison<unsigned_int,_unsigned_int> *)&subReader,(uint *)&_kjCondition_22,
               (uint *)&_kjCondition_9);
  }
  subReader._builder.data = reader._builder.pointers + 7;
  subReader._builder._0_16_ = auVar3;
  PointerBuilder::getList
            ((ListBuilder *)&_kjCondition,(PointerBuilder *)&subReader,FOUR_BYTES,(word *)0x0);
  subReader._builder.segment = (SegmentBuilder *)(_kjCondition._24_8_ << 0x20);
  subReader._builder.capTable = (CapTableBuilder *)anon_var_dwarf_3a16;
  subReader._builder.data = &DAT_00000005;
  subReader._builder.pointers._0_1_ = _kjCondition._24_4_ == 0;
  if ((!(bool)subReader._builder.pointers._0_1_) && (kj::_::Debug::minSeverity < 3)) {
    auVar29._12_4_ = 0;
    auVar29._0_12_ = auStack_84._0_12_;
    __kjCondition_22 = (ArrayPtr<unsigned_char>)(auVar29 << 0x20);
    __kjCondition_9 = (ArrayPtr<unsigned_char>)auVar3;
    PointerBuilder::getList
              ((ListBuilder *)&_kjCondition,(PointerBuilder *)&_kjCondition_9,FOUR_BYTES,(word *)0x0
              );
    uVar43 = _kjCondition._24_8_;
    _kjCondition_9.value = _kjCondition.result;
    auStack_af._0_3_ = _kjCondition._25_3_;
    _kjCondition._24_8_ = uVar43;
    kj::_::Debug::
    log<char_const(&)[56],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1fd,ERROR,
               "\"failed: expected \" \"(0u) == (reader.getInt32List().size())\", _kjCondition, 0u, reader.getInt32List().size()"
               ,(char (*) [56])"failed: expected (0u) == (reader.getInt32List().size())",
               (DebugComparison<unsigned_int,_unsigned_int> *)&subReader,(uint *)&_kjCondition_22,
               (uint *)&_kjCondition_9);
  }
  subReader._builder.data = reader._builder.pointers + 8;
  subReader._builder._0_16_ = auVar3;
  PointerBuilder::getList
            ((ListBuilder *)&_kjCondition,(PointerBuilder *)&subReader,EIGHT_BYTES,(word *)0x0);
  subReader._builder.segment = (SegmentBuilder *)(_kjCondition._24_8_ << 0x20);
  subReader._builder.capTable = (CapTableBuilder *)anon_var_dwarf_3a16;
  subReader._builder.data = &DAT_00000005;
  subReader._builder.pointers._0_1_ = _kjCondition._24_4_ == 0;
  if ((!(bool)subReader._builder.pointers._0_1_) && (kj::_::Debug::minSeverity < 3)) {
    auVar30._12_4_ = 0;
    auVar30._0_12_ = auStack_84._0_12_;
    __kjCondition_22 = (ArrayPtr<unsigned_char>)(auVar30 << 0x20);
    __kjCondition_9 = (ArrayPtr<unsigned_char>)auVar3;
    PointerBuilder::getList
              ((ListBuilder *)&_kjCondition,(PointerBuilder *)&_kjCondition_9,EIGHT_BYTES,
               (word *)0x0);
    uVar43 = _kjCondition._24_8_;
    _kjCondition_9.value = _kjCondition.result;
    auStack_af._0_3_ = _kjCondition._25_3_;
    _kjCondition._24_8_ = uVar43;
    kj::_::Debug::
    log<char_const(&)[56],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1fe,ERROR,
               "\"failed: expected \" \"(0u) == (reader.getInt64List().size())\", _kjCondition, 0u, reader.getInt64List().size()"
               ,(char (*) [56])"failed: expected (0u) == (reader.getInt64List().size())",
               (DebugComparison<unsigned_int,_unsigned_int> *)&subReader,(uint *)&_kjCondition_22,
               (uint *)&_kjCondition_9);
  }
  subReader._builder.data = reader._builder.pointers + 9;
  subReader._builder._0_16_ = auVar3;
  PointerBuilder::getList
            ((ListBuilder *)&_kjCondition,(PointerBuilder *)&subReader,BYTE,(word *)0x0);
  subReader._builder.segment = (SegmentBuilder *)(_kjCondition._24_8_ << 0x20);
  subReader._builder.capTable = (CapTableBuilder *)anon_var_dwarf_3a16;
  subReader._builder.data = &DAT_00000005;
  subReader._builder.pointers._0_1_ = _kjCondition._24_4_ == 0;
  if ((!(bool)subReader._builder.pointers._0_1_) && (kj::_::Debug::minSeverity < 3)) {
    auVar31._12_4_ = 0;
    auVar31._0_12_ = auStack_84._0_12_;
    __kjCondition_22 = (ArrayPtr<unsigned_char>)(auVar31 << 0x20);
    __kjCondition_9 = (ArrayPtr<unsigned_char>)auVar3;
    PointerBuilder::getList
              ((ListBuilder *)&_kjCondition,(PointerBuilder *)&_kjCondition_9,BYTE,(word *)0x0);
    uVar43 = _kjCondition._24_8_;
    _kjCondition_9.value = _kjCondition.result;
    auStack_af._0_3_ = _kjCondition._25_3_;
    _kjCondition._24_8_ = uVar43;
    kj::_::Debug::
    log<char_const(&)[56],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1ff,ERROR,
               "\"failed: expected \" \"(0u) == (reader.getUInt8List().size())\", _kjCondition, 0u, reader.getUInt8List().size()"
               ,(char (*) [56])"failed: expected (0u) == (reader.getUInt8List().size())",
               (DebugComparison<unsigned_int,_unsigned_int> *)&subReader,(uint *)&_kjCondition_22,
               (uint *)&_kjCondition_9);
  }
  subReader._builder.data = reader._builder.pointers + 10;
  subReader._builder._0_16_ = auVar3;
  PointerBuilder::getList
            ((ListBuilder *)&_kjCondition,(PointerBuilder *)&subReader,TWO_BYTES,(word *)0x0);
  subReader._builder.segment = (SegmentBuilder *)(_kjCondition._24_8_ << 0x20);
  subReader._builder.capTable = (CapTableBuilder *)anon_var_dwarf_3a16;
  subReader._builder.data = &DAT_00000005;
  subReader._builder.pointers._0_1_ = _kjCondition._24_4_ == 0;
  if ((!(bool)subReader._builder.pointers._0_1_) && (kj::_::Debug::minSeverity < 3)) {
    auVar32._12_4_ = 0;
    auVar32._0_12_ = auStack_84._0_12_;
    __kjCondition_22 = (ArrayPtr<unsigned_char>)(auVar32 << 0x20);
    __kjCondition_9 = (ArrayPtr<unsigned_char>)auVar3;
    PointerBuilder::getList
              ((ListBuilder *)&_kjCondition,(PointerBuilder *)&_kjCondition_9,TWO_BYTES,(word *)0x0)
    ;
    uVar43 = _kjCondition._24_8_;
    _kjCondition_9.value = _kjCondition.result;
    auStack_af._0_3_ = _kjCondition._25_3_;
    _kjCondition._24_8_ = uVar43;
    kj::_::Debug::
    log<char_const(&)[57],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x200,ERROR,
               "\"failed: expected \" \"(0u) == (reader.getUInt16List().size())\", _kjCondition, 0u, reader.getUInt16List().size()"
               ,(char (*) [57])"failed: expected (0u) == (reader.getUInt16List().size())",
               (DebugComparison<unsigned_int,_unsigned_int> *)&subReader,(uint *)&_kjCondition_22,
               (uint *)&_kjCondition_9);
  }
  subReader._builder.data = reader._builder.pointers + 0xb;
  subReader._builder._0_16_ = auVar3;
  PointerBuilder::getList
            ((ListBuilder *)&_kjCondition,(PointerBuilder *)&subReader,FOUR_BYTES,(word *)0x0);
  subReader._builder.segment = (SegmentBuilder *)(_kjCondition._24_8_ << 0x20);
  subReader._builder.capTable = (CapTableBuilder *)anon_var_dwarf_3a16;
  subReader._builder.data = &DAT_00000005;
  subReader._builder.pointers._0_1_ = _kjCondition._24_4_ == 0;
  if ((!(bool)subReader._builder.pointers._0_1_) && (kj::_::Debug::minSeverity < 3)) {
    auVar33._12_4_ = 0;
    auVar33._0_12_ = auStack_84._0_12_;
    __kjCondition_22 = (ArrayPtr<unsigned_char>)(auVar33 << 0x20);
    __kjCondition_9 = (ArrayPtr<unsigned_char>)auVar3;
    PointerBuilder::getList
              ((ListBuilder *)&_kjCondition,(PointerBuilder *)&_kjCondition_9,FOUR_BYTES,(word *)0x0
              );
    uVar43 = _kjCondition._24_8_;
    _kjCondition_9.value = _kjCondition.result;
    auStack_af._0_3_ = _kjCondition._25_3_;
    _kjCondition._24_8_ = uVar43;
    kj::_::Debug::
    log<char_const(&)[57],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x201,ERROR,
               "\"failed: expected \" \"(0u) == (reader.getUInt32List().size())\", _kjCondition, 0u, reader.getUInt32List().size()"
               ,(char (*) [57])"failed: expected (0u) == (reader.getUInt32List().size())",
               (DebugComparison<unsigned_int,_unsigned_int> *)&subReader,(uint *)&_kjCondition_22,
               (uint *)&_kjCondition_9);
  }
  subReader._builder.data = reader._builder.pointers + 0xc;
  subReader._builder._0_16_ = auVar3;
  PointerBuilder::getList
            ((ListBuilder *)&_kjCondition,(PointerBuilder *)&subReader,EIGHT_BYTES,(word *)0x0);
  subReader._builder.segment = (SegmentBuilder *)(_kjCondition._24_8_ << 0x20);
  subReader._builder.capTable = (CapTableBuilder *)anon_var_dwarf_3a16;
  subReader._builder.data = &DAT_00000005;
  subReader._builder.pointers._0_1_ = _kjCondition._24_4_ == 0;
  if ((!(bool)subReader._builder.pointers._0_1_) && (kj::_::Debug::minSeverity < 3)) {
    auVar34._12_4_ = 0;
    auVar34._0_12_ = auStack_84._0_12_;
    __kjCondition_22 = (ArrayPtr<unsigned_char>)(auVar34 << 0x20);
    __kjCondition_9 = (ArrayPtr<unsigned_char>)auVar3;
    PointerBuilder::getList
              ((ListBuilder *)&_kjCondition,(PointerBuilder *)&_kjCondition_9,EIGHT_BYTES,
               (word *)0x0);
    uVar43 = _kjCondition._24_8_;
    _kjCondition_9.value = _kjCondition.result;
    auStack_af._0_3_ = _kjCondition._25_3_;
    _kjCondition._24_8_ = uVar43;
    kj::_::Debug::
    log<char_const(&)[57],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x202,ERROR,
               "\"failed: expected \" \"(0u) == (reader.getUInt64List().size())\", _kjCondition, 0u, reader.getUInt64List().size()"
               ,(char (*) [57])"failed: expected (0u) == (reader.getUInt64List().size())",
               (DebugComparison<unsigned_int,_unsigned_int> *)&subReader,(uint *)&_kjCondition_22,
               (uint *)&_kjCondition_9);
  }
  subReader._builder.data = reader._builder.pointers + 0xd;
  subReader._builder._0_16_ = auVar3;
  PointerBuilder::getList
            ((ListBuilder *)&_kjCondition,(PointerBuilder *)&subReader,FOUR_BYTES,(word *)0x0);
  subReader._builder.segment = (SegmentBuilder *)(_kjCondition._24_8_ << 0x20);
  subReader._builder.capTable = (CapTableBuilder *)anon_var_dwarf_3a16;
  subReader._builder.data = &DAT_00000005;
  subReader._builder.pointers._0_1_ = _kjCondition._24_4_ == 0;
  if ((!(bool)subReader._builder.pointers._0_1_) && (kj::_::Debug::minSeverity < 3)) {
    auVar35._12_4_ = 0;
    auVar35._0_12_ = auStack_84._0_12_;
    __kjCondition_22 = (ArrayPtr<unsigned_char>)(auVar35 << 0x20);
    __kjCondition_9 = (ArrayPtr<unsigned_char>)auVar3;
    PointerBuilder::getList
              ((ListBuilder *)&_kjCondition,(PointerBuilder *)&_kjCondition_9,FOUR_BYTES,(word *)0x0
              );
    uVar43 = _kjCondition._24_8_;
    _kjCondition_9.value = _kjCondition.result;
    auStack_af._0_3_ = _kjCondition._25_3_;
    _kjCondition._24_8_ = uVar43;
    kj::_::Debug::
    log<char_const(&)[58],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x203,ERROR,
               "\"failed: expected \" \"(0u) == (reader.getFloat32List().size())\", _kjCondition, 0u, reader.getFloat32List().size()"
               ,(char (*) [58])"failed: expected (0u) == (reader.getFloat32List().size())",
               (DebugComparison<unsigned_int,_unsigned_int> *)&subReader,(uint *)&_kjCondition_22,
               (uint *)&_kjCondition_9);
  }
  subReader._builder.data = reader._builder.pointers + 0xe;
  subReader._builder._0_16_ = auVar3;
  PointerBuilder::getList
            ((ListBuilder *)&_kjCondition,(PointerBuilder *)&subReader,EIGHT_BYTES,(word *)0x0);
  subReader._builder.segment = (SegmentBuilder *)(_kjCondition._24_8_ << 0x20);
  subReader._builder.capTable = (CapTableBuilder *)anon_var_dwarf_3a16;
  subReader._builder.data = &DAT_00000005;
  subReader._builder.pointers._0_1_ = _kjCondition._24_4_ == 0;
  if ((!(bool)subReader._builder.pointers._0_1_) && (kj::_::Debug::minSeverity < 3)) {
    auVar36._12_4_ = 0;
    auVar36._0_12_ = auStack_84._0_12_;
    __kjCondition_22 = (ArrayPtr<unsigned_char>)(auVar36 << 0x20);
    __kjCondition_9 = (ArrayPtr<unsigned_char>)auVar3;
    PointerBuilder::getList
              ((ListBuilder *)&_kjCondition,(PointerBuilder *)&_kjCondition_9,EIGHT_BYTES,
               (word *)0x0);
    uVar43 = _kjCondition._24_8_;
    _kjCondition_9.value = _kjCondition.result;
    auStack_af._0_3_ = _kjCondition._25_3_;
    _kjCondition._24_8_ = uVar43;
    kj::_::Debug::
    log<char_const(&)[58],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x204,ERROR,
               "\"failed: expected \" \"(0u) == (reader.getFloat64List().size())\", _kjCondition, 0u, reader.getFloat64List().size()"
               ,(char (*) [58])"failed: expected (0u) == (reader.getFloat64List().size())",
               (DebugComparison<unsigned_int,_unsigned_int> *)&subReader,(uint *)&_kjCondition_22,
               (uint *)&_kjCondition_9);
  }
  subReader._builder.data = reader._builder.pointers + 0xf;
  subReader._builder._0_16_ = auVar3;
  PointerBuilder::getList
            ((ListBuilder *)&_kjCondition,(PointerBuilder *)&subReader,POINTER,(word *)0x0);
  subReader._builder.segment = (SegmentBuilder *)(_kjCondition._24_8_ << 0x20);
  subReader._builder.capTable = (CapTableBuilder *)anon_var_dwarf_3a16;
  subReader._builder.data = &DAT_00000005;
  subReader._builder.pointers._0_1_ = _kjCondition._24_4_ == 0;
  if ((!(bool)subReader._builder.pointers._0_1_) && (kj::_::Debug::minSeverity < 3)) {
    auVar37._12_4_ = 0;
    auVar37._0_12_ = auStack_84._0_12_;
    __kjCondition_22 = (ArrayPtr<unsigned_char>)(auVar37 << 0x20);
    __kjCondition_9 = (ArrayPtr<unsigned_char>)auVar3;
    PointerBuilder::getList
              ((ListBuilder *)&_kjCondition,(PointerBuilder *)&_kjCondition_9,POINTER,(word *)0x0);
    uVar43 = _kjCondition._24_8_;
    _kjCondition_9.value = _kjCondition.result;
    auStack_af._0_3_ = _kjCondition._25_3_;
    _kjCondition._24_8_ = uVar43;
    kj::_::Debug::
    log<char_const(&)[55],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x205,ERROR,
               "\"failed: expected \" \"(0u) == (reader.getTextList().size())\", _kjCondition, 0u, reader.getTextList().size()"
               ,(char (*) [55])"failed: expected (0u) == (reader.getTextList().size())",
               (DebugComparison<unsigned_int,_unsigned_int> *)&subReader,(uint *)&_kjCondition_22,
               (uint *)&_kjCondition_9);
  }
  subReader._builder.data = reader._builder.pointers + 0x10;
  subReader._builder._0_16_ = auVar3;
  PointerBuilder::getList
            ((ListBuilder *)&_kjCondition,(PointerBuilder *)&subReader,POINTER,(word *)0x0);
  subReader._builder.segment = (SegmentBuilder *)(_kjCondition._24_8_ << 0x20);
  subReader._builder.capTable = (CapTableBuilder *)anon_var_dwarf_3a16;
  subReader._builder.data = &DAT_00000005;
  subReader._builder.pointers._0_1_ = _kjCondition._24_4_ == 0;
  if ((!(bool)subReader._builder.pointers._0_1_) && (kj::_::Debug::minSeverity < 3)) {
    auVar38._12_4_ = 0;
    auVar38._0_12_ = auStack_84._0_12_;
    __kjCondition_22 = (ArrayPtr<unsigned_char>)(auVar38 << 0x20);
    __kjCondition_9 = (ArrayPtr<unsigned_char>)auVar3;
    PointerBuilder::getList
              ((ListBuilder *)&_kjCondition,(PointerBuilder *)&_kjCondition_9,POINTER,(word *)0x0);
    uVar43 = _kjCondition._24_8_;
    _kjCondition_9.value = _kjCondition.result;
    auStack_af._0_3_ = _kjCondition._25_3_;
    _kjCondition._24_8_ = uVar43;
    kj::_::Debug::
    log<char_const(&)[55],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x206,ERROR,
               "\"failed: expected \" \"(0u) == (reader.getDataList().size())\", _kjCondition, 0u, reader.getDataList().size()"
               ,(char (*) [55])"failed: expected (0u) == (reader.getDataList().size())",
               (DebugComparison<unsigned_int,_unsigned_int> *)&subReader,(uint *)&_kjCondition_22,
               (uint *)&_kjCondition_9);
  }
  subReader._builder.data = reader._builder.pointers + 0x11;
  subReader._builder._0_16_ = auVar3;
  PointerBuilder::getStructList
            ((ListBuilder *)&_kjCondition,(PointerBuilder *)&subReader,(StructSize)0x140006,
             (word *)0x0);
  subReader._builder.segment = (SegmentBuilder *)(_kjCondition._24_8_ << 0x20);
  subReader._builder.capTable = (CapTableBuilder *)" == ";
  subReader._builder.data = &DAT_00000005;
  subReader._builder.pointers._0_1_ = _kjCondition._24_4_ == 0;
  if ((!(bool)subReader._builder.pointers._0_1_) && (kj::_::Debug::minSeverity < 3)) {
    auVar39._12_4_ = 0;
    auVar39._0_12_ = auStack_84._0_12_;
    __kjCondition_22 = (ArrayPtr<unsigned_char>)(auVar39 << 0x20);
    __kjCondition_9 = (ArrayPtr<unsigned_char>)auVar3;
    PointerBuilder::getStructList
              ((ListBuilder *)&_kjCondition,(PointerBuilder *)&_kjCondition_9,(StructSize)0x140006,
               (word *)0x0);
    uVar43 = _kjCondition._24_8_;
    _kjCondition_9.value = _kjCondition.result;
    auStack_af._0_3_ = _kjCondition._25_3_;
    _kjCondition._24_8_ = uVar43;
    kj::_::Debug::
    log<char_const(&)[57],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x207,ERROR,
               "\"failed: expected \" \"(0u) == (reader.getStructList().size())\", _kjCondition, 0u, reader.getStructList().size()"
               ,(char (*) [57])"failed: expected (0u) == (reader.getStructList().size())",
               (DebugComparison<unsigned_int,_unsigned_int> *)&subReader,(uint *)&_kjCondition_22,
               (uint *)&_kjCondition_9);
  }
  return;
}

Assistant:

void genericCheckTestMessageAllZero(Reader reader) {
  EXPECT_EQ(VOID, reader.getVoidField());
  EXPECT_EQ(false, reader.getBoolField());
  EXPECT_EQ(0, reader.getInt8Field());
  EXPECT_EQ(0, reader.getInt16Field());
  EXPECT_EQ(0, reader.getInt32Field());
  EXPECT_EQ(0, reader.getInt64Field());
  EXPECT_EQ(0u, reader.getUInt8Field());
  EXPECT_EQ(0u, reader.getUInt16Field());
  EXPECT_EQ(0u, reader.getUInt32Field());
  EXPECT_EQ(0u, reader.getUInt64Field());
  EXPECT_FLOAT_EQ(0, reader.getFloat32Field());
  EXPECT_DOUBLE_EQ(0, reader.getFloat64Field());
  EXPECT_EQ("", reader.getTextField());
  EXPECT_EQ(data(""), reader.getDataField());
  {
    auto subReader = reader.getStructField();
    EXPECT_EQ(VOID, subReader.getVoidField());
    EXPECT_EQ(false, subReader.getBoolField());
    EXPECT_EQ(0, subReader.getInt8Field());
    EXPECT_EQ(0, subReader.getInt16Field());
    EXPECT_EQ(0, subReader.getInt32Field());
    EXPECT_EQ(0, subReader.getInt64Field());
    EXPECT_EQ(0u, subReader.getUInt8Field());
    EXPECT_EQ(0u, subReader.getUInt16Field());
    EXPECT_EQ(0u, subReader.getUInt32Field());
    EXPECT_EQ(0u, subReader.getUInt64Field());
    EXPECT_FLOAT_EQ(0, subReader.getFloat32Field());
    EXPECT_DOUBLE_EQ(0, subReader.getFloat64Field());
    EXPECT_EQ("", subReader.getTextField());
    EXPECT_EQ(data(""), subReader.getDataField());
    {
      auto subSubReader = subReader.getStructField();
      EXPECT_EQ("", subSubReader.getTextField());
      EXPECT_EQ("", subSubReader.getStructField().getTextField());
    }

    EXPECT_EQ(0u, subReader.getVoidList().size());
    EXPECT_EQ(0u, subReader.getBoolList().size());
    EXPECT_EQ(0u, subReader.getInt8List().size());
    EXPECT_EQ(0u, subReader.getInt16List().size());
    EXPECT_EQ(0u, subReader.getInt32List().size());
    EXPECT_EQ(0u, subReader.getInt64List().size());
    EXPECT_EQ(0u, subReader.getUInt8List().size());
    EXPECT_EQ(0u, subReader.getUInt16List().size());
    EXPECT_EQ(0u, subReader.getUInt32List().size());
    EXPECT_EQ(0u, subReader.getUInt64List().size());
    EXPECT_EQ(0u, subReader.getFloat32List().size());
    EXPECT_EQ(0u, subReader.getFloat64List().size());
    EXPECT_EQ(0u, subReader.getTextList().size());
    EXPECT_EQ(0u, subReader.getDataList().size());
    EXPECT_EQ(0u, subReader.getStructList().size());
  }

  EXPECT_EQ(0u, reader.getVoidList().size());
  EXPECT_EQ(0u, reader.getBoolList().size());
  EXPECT_EQ(0u, reader.getInt8List().size());
  EXPECT_EQ(0u, reader.getInt16List().size());
  EXPECT_EQ(0u, reader.getInt32List().size());
  EXPECT_EQ(0u, reader.getInt64List().size());
  EXPECT_EQ(0u, reader.getUInt8List().size());
  EXPECT_EQ(0u, reader.getUInt16List().size());
  EXPECT_EQ(0u, reader.getUInt32List().size());
  EXPECT_EQ(0u, reader.getUInt64List().size());
  EXPECT_EQ(0u, reader.getFloat32List().size());
  EXPECT_EQ(0u, reader.getFloat64List().size());
  EXPECT_EQ(0u, reader.getTextList().size());
  EXPECT_EQ(0u, reader.getDataList().size());
  EXPECT_EQ(0u, reader.getStructList().size());
}